

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

char * CVmObjBigNum::cache_dbl_max(void)

{
  char *ext_00;
  size_t sVar1;
  char *unaff_retaddr;
  char *ext;
  int expanded;
  size_t prec;
  CVmBigNumCache *siz;
  CVmBigNumCache *in_stack_ffffffffffffffe0;
  int local_14;
  double in_stack_fffffffffffffff8;
  
  siz = S_bignum_cache;
  calc_alloc(0xf);
  ext_00 = CVmBigNumCache::get_dbl_max_reg(in_stack_ffffffffffffffe0,(size_t)siz,(int *)0x2c2a73);
  if (ext_00 != (char *)0x0) {
    if ((local_14 != 0) || (sVar1 = get_prec((char *)0x2c2a9b), sVar1 < 0xf)) {
      set_prec(ext_00,(size_t)siz);
      set_double_val(unaff_retaddr,in_stack_fffffffffffffff8);
    }
    return ext_00;
  }
  err_throw(0);
}

Assistant:

const char *CVmObjBigNum::cache_dbl_max()
{
    /* get the cache register; use the platform precision for a double */
    size_t prec = DBL_DIG;
    int expanded;
    char *ext = S_bignum_cache->get_dbl_max_reg(calc_alloc(prec), &expanded);

    /* if that failed, throw an error */
    if (ext == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* if we got a previously cached value, return it */
    if (!expanded && get_prec(ext) >= prec)
        return ext;

    /* we allocated or reallocated the register, so set the new precision */
    set_prec(ext, prec);

    /* store DBL_MAX in the register */
    set_double_val(ext, DBL_MAX);

    /* return the register */
    return ext;
}